

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unicode_filenames.cc
# Opt level: O0

int copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int extraout_EAX;
  FILE *in_00;
  FILE *out_00;
  FILE *out;
  FILE *in;
  char *outname_local;
  
  in_00 = fopen("minimal.pdf","rb");
  out_00 = fopen((char *)dst,"wb");
  do_copy((FILE *)in_00,(FILE *)out_00);
  return extraout_EAX;
}

Assistant:

void
copy(char const* outname)
{
    FILE* in = fopen("minimal.pdf", "rb");
    FILE* out = fopen(outname, "wb");
    do_copy(in, out);
}